

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int ParseEXRHeaderFromMemory
              (EXRHeader *exr_header,EXRVersion *version,uchar *memory,size_t size,char **err)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  size_t i;
  ulong uVar6;
  long lVar7;
  string err_str;
  string err_str_1;
  HeaderInfo info;
  
  if (exr_header == (EXRHeader *)0x0 || memory == (uchar *)0x0) {
    std::__cxx11::string::string
              ((string *)&info,
               "Invalid argument. `memory` or `exr_header` argument is null in ParseEXRHeaderFromMemory()"
               ,(allocator *)&err_str);
    tinyexr::SetErrorMessage((string *)&info,err);
    std::__cxx11::string::~string((string *)&info);
    iVar4 = -3;
  }
  else if (size < 8) {
    std::__cxx11::string::string
              ((string *)&info,"Insufficient header/data size.\n",(allocator *)&err_str);
    tinyexr::SetErrorMessage((string *)&info,err);
    std::__cxx11::string::~string((string *)&info);
    iVar4 = -4;
  }
  else {
    info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
    info.attributes.super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    info.attributes.super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    info.channels.super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    info.attributes.super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    info.channels.super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    info.channels.super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    info.name._M_string_length = 0;
    info.name.field_2._M_local_buf[0] = '\0';
    info.type._M_dataplus._M_p = (pointer)&info.type.field_2;
    info.type._M_string_length = 0;
    info.type.field_2._M_local_buf[0] = '\0';
    tinyexr::HeaderInfo::clear(&info);
    err_str._M_dataplus._M_p = (pointer)&err_str.field_2;
    err_str._M_string_length = 0;
    err_str.field_2._M_local_buf[0] = '\0';
    iVar4 = tinyexr::ParseEXRHeader(&info,(bool *)0x0,version,&err_str,memory + 8,size - 8);
    if (((err != (char **)0x0) && (iVar4 != 0)) && (err_str._M_string_length != 0)) {
      pcVar5 = strdup(err_str._M_dataplus._M_p);
      *err = pcVar5;
    }
    std::__cxx11::string::~string((string *)&err_str);
    err_str._M_dataplus._M_p = (pointer)&err_str.field_2;
    err_str._M_string_length = 0;
    err_str.field_2._M_local_buf[0] = '\0';
    err_str_1._M_dataplus._M_p = (pointer)&err_str_1.field_2;
    err_str_1._M_string_length = 0;
    err_str_1.field_2._M_local_buf[0] = '\0';
    bVar3 = tinyexr::ConvertHeader(exr_header,&info,&err_str,&err_str_1);
    if (!bVar3) {
      lVar7 = 0x200;
      for (uVar6 = 0;
          uVar6 < (ulong)(((long)info.attributes.
                                 super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)info.attributes.
                                super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
                                _M_impl.super__Vector_impl_data._M_start) / 0x210);
          uVar6 = uVar6 + 1) {
        free(*(void **)((info.attributes.
                         super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                         super__Vector_impl_data._M_start)->name + lVar7));
        lVar7 = lVar7 + 0x210;
      }
      iVar4 = -9;
      if ((err != (char **)0x0) && (err_str_1._M_string_length != 0)) {
        pcVar5 = strdup(err_str_1._M_dataplus._M_p);
        *err = pcVar5;
      }
    }
    std::__cxx11::string::~string((string *)&err_str_1);
    std::__cxx11::string::~string((string *)&err_str);
    uVar1 = version->non_image;
    uVar2 = version->multipart;
    uVar6 = ~CONCAT44(-(uint)(uVar2 == 0),-(uint)(uVar1 == 0)) & (ulong)DAT_002d4da0;
    exr_header->non_image = (int)uVar6;
    exr_header->multipart = (int)(uVar6 >> 0x20);
    tinyexr::HeaderInfo::~HeaderInfo(&info);
  }
  return iVar4;
}

Assistant:

int ParseEXRHeaderFromMemory(EXRHeader *exr_header, const EXRVersion *version,
                             const unsigned char *memory, size_t size,
                             const char **err) {
  if (memory == NULL || exr_header == NULL) {
    tinyexr::SetErrorMessage(
        "Invalid argument. `memory` or `exr_header` argument is null in "
        "ParseEXRHeaderFromMemory()",
        err);

    // Invalid argument
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (size < tinyexr::kEXRVersionSize) {
    tinyexr::SetErrorMessage("Insufficient header/data size.\n", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }

  const unsigned char *marker = memory + tinyexr::kEXRVersionSize;
  size_t marker_size = size - tinyexr::kEXRVersionSize;

  tinyexr::HeaderInfo info;
  info.clear();

  int ret;
  {
    std::string err_str;
    ret = ParseEXRHeader(&info, NULL, version, &err_str, marker, marker_size);

    if (ret != TINYEXR_SUCCESS) {
      if (err && !err_str.empty()) {
        tinyexr::SetErrorMessage(err_str, err);
      }
    }
  }

  {
    std::string warn;
    std::string err_str;

    if (!ConvertHeader(exr_header, info, &warn, &err_str)) {
      // release mem
      for (size_t i = 0; i < info.attributes.size(); i++) {
        if (info.attributes[i].value) {
          free(info.attributes[i].value);
        }
      }
      if (err && !err_str.empty()) {
        tinyexr::SetErrorMessage(err_str, err);
      }
      ret = TINYEXR_ERROR_INVALID_HEADER;
    }
  }

  exr_header->multipart = version->multipart ? 1 : 0;
  exr_header->non_image = version->non_image ? 1 : 0;

  return ret;
}